

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

__int128 * __thiscall
calculator::ExpressionParser<__int128>::getInteger(ExpressionParser<__int128> *this)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  __int128 *p_Var4;
  
  cVar3 = '\0';
  iVar1 = 0;
  if (this->index_ < (this->expr_)._M_string_length) {
    cVar3 = (this->expr_)._M_dataplus._M_p[this->index_];
    iVar1 = (int)cVar3;
    if ((byte)(cVar3 - 0x30U) < 10) {
      uVar2 = iVar1 - 0x30;
    }
    else {
      if (5 < (byte)(cVar3 + 0x9fU)) goto LAB_001189b0;
      uVar2 = iVar1 - 0x57;
    }
    p_Var4 = (__int128 *)(ulong)uVar2;
  }
  else {
LAB_001189b0:
    p_Var4 = (__int128 *)0x10;
    if ((byte)(cVar3 + 0xbfU) < 6) {
      p_Var4 = (__int128 *)(ulong)(iVar1 - 0x37);
    }
  }
  return p_Var4;
}

Assistant:

bool isEnd() const
  {
    return index_ >= expr_.size();
  }